

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv_udp_set_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,uv_membership membership)

{
  in_addr_t iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  undefined8 local_20;
  
  local_20 = 0;
  if (interface_addr == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = inet_addr(interface_addr);
  }
  local_20._4_4_ = iVar1;
  iVar1 = inet_addr(multicast_addr);
  local_20 = CONCAT44(local_20._4_4_,iVar1);
  if (membership == UV_JOIN_GROUP) {
    iVar2 = 0x23;
  }
  else {
    if (membership != UV_LEAVE_GROUP) {
      return -0x16;
    }
    iVar2 = 0x24;
  }
  iVar4 = 0;
  iVar2 = setsockopt((handle->io_watcher).fd,0,iVar2,&local_20,8);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    iVar4 = -*piVar3;
  }
  return iVar4;
}

Assistant:

int uv_udp_set_membership(uv_udp_t* handle,
                          const char* multicast_addr,
                          const char* interface_addr,
                          uv_membership membership) {
  struct ip_mreq mreq;
  int optname;

  memset(&mreq, 0, sizeof mreq);

  if (interface_addr) {
    mreq.imr_interface.s_addr = inet_addr(interface_addr);
  } else {
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  }

  mreq.imr_multiaddr.s_addr = inet_addr(multicast_addr);

  switch (membership) {
  case UV_JOIN_GROUP:
    optname = IP_ADD_MEMBERSHIP;
    break;
  case UV_LEAVE_GROUP:
    optname = IP_DROP_MEMBERSHIP;
    break;
  default:
    return -EINVAL;
  }

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IP,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
    return -errno;
  }

  return 0;
}